

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

bool __thiscall AllDiffDomain<0>::tarjan(AllDiffDomain<0> *this,int node)

{
  IntVar *pIVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int in_ESI;
  iterator *in_RDI;
  AllDiffDomain<0> *unaff_retaddr;
  int i_1;
  int scc;
  int leak;
  int var;
  int val;
  iterator i;
  int index_save;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_78;
  IntView<0> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffe4;
  int iVar5;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  *(undefined1 *)((long)&(&(in_RDI[2].forward.var)->max)[(long)in_ESI * 5].v + 1) = 1;
  iVar5 = in_RDI[3].forward.val;
  in_RDI[3].forward.val = iVar5 + 1;
  (&(in_RDI[2].forward.var)->var_id)[(long)in_ESI * 5] = iVar5;
  *(undefined4 *)((long)&(in_RDI[2].forward.var)->super_Var + (long)in_ESI * 0x14) =
       *(undefined4 *)&in_RDI[3].forward.field_0xc;
  *(int *)&in_RDI[3].forward.field_0xc = in_ESI;
  (&(in_RDI[2].forward.var)->min)[(long)in_ESI * 5].v = -1;
  *(undefined1 *)&(&(in_RDI[2].forward.var)->max)[(long)in_ESI * 5].v = 0;
  if (in_ESI < *(int *)&in_RDI[1].forward.var) {
    IntView<0>::begin(in_stack_ffffffffffffffc0);
    while( true ) {
      IntView<0>::end(in_stack_ffffffffffffffc0);
      bVar2 = IntView<0>::iterator::operator!=
                        (in_RDI,(iterator *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (!bVar2) break;
      IntView<0>::iterator::operator++(in_RDI,in_stack_ffffffffffffff7c);
      iVar3 = IntView<0>::iterator::operator*(in_RDI);
      if (((*(byte *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 0x11) & 1) == 0) &&
         (bVar2 = tarjan((AllDiffDomain<0> *)CONCAT44(in_ESI,iVar5),in_stack_ffffffffffffffe4),
         !bVar2)) {
        return false;
      }
      if (*(int *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 0xc) < 0) {
        piVar4 = std::min<int>(&(in_RDI[2].forward.var)->var_id + (long)in_ESI * 5,
                               (int *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 8));
        (&(in_RDI[2].forward.var)->var_id)[(long)in_ESI * 5] = *piVar4;
      }
      else if (((*(byte *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 0x10) & 1) == 0)
              && (bVar2 = prune(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 !bVar2)) {
        return false;
      }
      pIVar1 = in_RDI[2].forward.var;
      *(bool *)&(&pIVar1->max)[(long)in_ESI * 5].v =
           ((&pIVar1->max)[(long)in_ESI * 5].v & 1) != 0 ||
           (*(byte *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 0x10) & 1) != 0;
    }
  }
  else {
    iVar3 = Tint::operator_cast_to_int
                      ((Tint *)((long)&(in_RDI[2].forward.var)->super_Var + (long)in_ESI * 0x14 + 4)
                      );
    if (iVar3 < 0) {
      *(undefined1 *)&(&(in_RDI[2].forward.var)->max)[(long)in_ESI * 5].v = 1;
    }
    else {
      if ((((&(in_RDI[2].forward.var)->max)[(long)iVar3 * 5].v & 0x100) == 0) &&
         (bVar2 = tarjan((AllDiffDomain<0> *)CONCAT44(in_ESI,iVar5),in_stack_ffffffffffffffe4),
         !bVar2)) {
        return false;
      }
      if ((&(in_RDI[2].forward.var)->min)[(long)iVar3 * 5].v < 0) {
        piVar4 = std::min<int>(&(in_RDI[2].forward.var)->var_id + (long)in_ESI * 5,
                               &(in_RDI[2].forward.var)->var_id + (long)iVar3 * 5);
        (&(in_RDI[2].forward.var)->var_id)[(long)in_ESI * 5] = *piVar4;
      }
      pIVar1 = in_RDI[2].forward.var;
      *(bool *)&(&pIVar1->max)[(long)in_ESI * 5].v =
           ((&pIVar1->max)[(long)in_ESI * 5].v & 1) != 0 ||
           ((&(in_RDI[2].forward.var)->max)[(long)iVar3 * 5].v & 1) != 0;
    }
  }
  if (iVar5 <= (&(in_RDI[2].forward.var)->var_id)[(long)in_ESI * 5]) {
    iVar3 = (&(in_RDI[2].forward.var)->max)[(long)in_ESI * 5].v;
    iVar5 = *(int *)&in_RDI[3].forward.field_0xc;
    *(undefined4 *)&in_RDI[3].forward.field_0xc =
         *(undefined4 *)((long)&(in_RDI[2].forward.var)->super_Var + (long)in_ESI * 0x14);
    *(undefined4 *)((long)&(in_RDI[2].forward.var)->super_Var + (long)in_ESI * 0x14) = 0xffffffff;
    for (local_78 = iVar5; -1 < local_78;
        local_78 = *(int *)((long)&(in_RDI[2].forward.var)->super_Var + (long)local_78 * 0x14)) {
      *(bool *)&(&(in_RDI[2].forward.var)->max)[(long)local_78 * 5].v = (iVar3 & 1) != 0;
      (&(in_RDI[2].forward.var)->min)[(long)local_78 * 5].v = iVar5;
    }
  }
  return true;
}

Assistant:

bool tarjan(int node) {
		var_nodes[node].mark = true;

		const int index_save = index++;
		var_nodes[node].index = index_save;

		var_nodes[node].next = stack;
		stack = node;
		var_nodes[node].scc = -1;  // means stacked

		var_nodes[node].leak = false;
		if (node < sz) {
			// visiting var node
			for (typename IntView<U>::iterator i = x[node].begin(); i != x[node].end();) {
				const int val = *i++;
				if (!val_nodes[val].mark && !tarjan(sz + val)) {
					return false;
				}
				if (val_nodes[val].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, val_nodes[val].index);
				} else if (!val_nodes[val].leak && !prune(node, val)) {
					return false;
				}
				var_nodes[node].leak |= val_nodes[val].leak;
			}
		} else {
			// visiting val node
			const int var = var_nodes[node].match;
			if (var < 0) {
				var_nodes[node].leak = true;  // unassigned value
			} else {
				if (!var_nodes[var].mark && !tarjan(var)) {
					return false;
				}
				if (var_nodes[var].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, var_nodes[var].index);
				}
				var_nodes[node].leak |= var_nodes[var].leak;
			}
		}

		if (var_nodes[node].index >= index_save) {  // node is SCC-root
			const int leak = static_cast<int>(var_nodes[node].leak);
			const int scc = stack;
			stack = var_nodes[node].next;
			var_nodes[node].next = -1;

			// fprintf(stderr, "leak %d\n", leak);
			for (int i = scc; i >= 0; i = var_nodes[i].next) {
				assert(var_nodes[i].mark);
				var_nodes[i].leak = (leak != 0);  // propagate through SCC
				var_nodes[i].scc = scc;           // propagate through SCC
																					// if (i < sz)
																					//  fprintf(stderr, "  var %d\n", i);
																					// else
																					//  fprintf(stderr, "  val %d\n", i - sz);
			}
		}
		return true;
	}